

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_desinit_fullscreen(CImgDisplay *this)

{
  Display *pDVar1;
  X11_info *pXVar2;
  Display *dpy;
  CImgDisplay *this_local;
  
  if ((this->_is_fullscreen & 1U) != 0) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    XUngrabKeyboard(pDVar1,0);
    if (this->_background_window != 0) {
      XDestroyWindow(pDVar1,this->_background_window);
    }
    this->_background_window = 0;
    this->_is_fullscreen = false;
  }
  return;
}

Assistant:

void _desinit_fullscreen() {
      if (!_is_fullscreen) return;
      Display *const dpy = cimg::X11_attr().display;
      XUngrabKeyboard(dpy,CurrentTime);
#ifdef cimg_use_xrandr
      if (cimg::X11_attr().resolutions && cimg::X11_attr().curr_resolution) {
        XRRScreenConfiguration *config = XRRGetScreenInfo(dpy,DefaultRootWindow(dpy));
        XRRSetScreenConfig(dpy,config,DefaultRootWindow(dpy),0,cimg::X11_attr().curr_rotation,CurrentTime);
        XRRFreeScreenConfigInfo(config);
        XSync(dpy,0);
        cimg::X11_attr().curr_resolution = 0;
      }
#endif
      if (_background_window) XDestroyWindow(dpy,_background_window);
      _background_window = 0;
      _is_fullscreen = false;
    }